

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_segtree_test.cpp
# Opt level: O1

void __thiscall
PersistentSegtree_Branching_Test::~PersistentSegtree_Branching_Test
          (PersistentSegtree_Branching_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentSegtree, Branching) {
    int n = 3;
    vector<Segtree*> trees;
    trees.push_back(new Segtree(0, n));
    trees.push_back(trees[0]->rangeUpdate(0, 2, 1));
    trees.push_back(trees[0]->rangeUpdate(1, 3, 2));
    trees.push_back(trees[1]->rangeUpdate(1, 3, 2));
    EXPECT_EQ(getAllValues(trees[1]), vector<ll>({1, 1, 0}));
    EXPECT_EQ(getAllValues(trees[2]), vector<ll>({0, 2, 2}));
    EXPECT_EQ(getAllValues(trees[3]), vector<ll>({1, 3, 2}));
}